

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall
loltoml::v_0_1_1::detail::parser_t<comments_skipper_t>::parse_kv_pair
          (parser_t<comments_skipper_t> *this)

{
  vector<sax_event_t,std::allocator<sax_event_t>> *this_00;
  type_t local_3c;
  string local_38;
  
  this_00 = (vector<sax_event_t,std::allocator<sax_event_t>> *)this->handler;
  parse_key_abi_cxx11_(&local_38,this);
  local_3c = key;
  std::vector<sax_event_t,std::allocator<sax_event_t>>::
  emplace_back<sax_event_t::type_t,std::__cxx11::string_const&>(this_00,&local_3c,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  skip_spaces(this);
  parse_chars<2ul>(this,(char (*) [2])0x195509);
  skip_spaces(this);
  parse_value(this);
  return;
}

Assistant:

void parse_kv_pair() {
        handler.key(parse_key());
        skip_spaces();
        parse_chars("=");
        skip_spaces();
        parse_value();
    }